

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<char8_t,std::allocator<char8_t>>,void>
               (vector<char8_t,_std::allocator<char8_t>_> *container,ostream *os)

{
  char8_t *value;
  char8_t *pcVar1;
  char8_t *pcVar2;
  long lVar3;
  
  std::operator<<(os,'{');
  pcVar1 = (container->super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (container->super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = 0;
  do {
    value = pcVar1 + lVar3;
    if (value == pcVar2) {
      if (pcVar2 != pcVar1) {
LAB_002c3656:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar3 != 0) && (std::operator<<(os,','), lVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_002c3656;
    }
    std::operator<<(os,' ');
    UniversalPrinter<char8_t>::Print(value,os);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }